

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManComputeCuts(Sbl_Man_t *p)

{
  Gia_Man_t *pGVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  word *pwVar5;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Wrd_t *p_02;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  abctime aVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong Entry;
  ulong uVar23;
  ulong uVar24;
  word wVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  Vec_Wrd_t *pVVar31;
  ulong uVar32;
  ulong Entry_00;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong Entry_01;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  int nSizeNew;
  ulong Entry_02;
  ulong uVar39;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  
  aVar11 = Abc_Clock();
  pVVar13 = p->vLeaves;
  if ((0x80 < pVVar13->nSize) || (iVar15 = p->vAnds->nSize, p->nVars < iVar15)) {
    __assert_fail("Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x2e2,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar15 = iVar15 + pVVar13->nSize;
  p->vCutsStart->nSize = 0;
  p->vCutsObj->nSize = 0;
  p->vCutsNum->nSize = 0;
  p->vCutsI1->nSize = 0;
  p->vCutsI2->nSize = 0;
  p->vCutsN1->nSize = 0;
  p->vCutsN2->nSize = 0;
  for (uVar22 = 0; (long)uVar22 < (long)pVVar13->nSize; uVar22 = uVar22 + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(pVVar13,(uint)uVar22);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p->vCutsStart,p->vCutsI1->nSize);
    Vec_IntPush(p->vCutsObj,-1);
    Vec_IntPush(p->vCutsNum,1);
    if (uVar22 < 0x40) {
      Vec_WrdPush(p->vCutsI1,1L << ((byte)uVar22 & 0x3f));
      pVVar31 = p->vCutsI2;
      wVar25 = 0;
    }
    else {
      Vec_WrdPush(p->vCutsI1,0);
      pVVar31 = p->vCutsI2;
      wVar25 = 1L << ((byte)uVar22 & 0x3f);
    }
    Vec_WrdPush(pVVar31,wVar25);
    Vec_WrdPush(p->vCutsN1,0);
    Vec_WrdPush(p->vCutsN2,0);
    pGVar12->Value = (uint)uVar22;
    pVVar13 = p->vLeaves;
  }
  for (uVar22 = 0; (long)uVar22 < (long)p->vAnds->nSize; uVar22 = uVar22 + 1) {
    pGVar1 = p->pGia;
    iVar10 = (int)uVar22;
    iVar6 = Vec_IntEntry(p->vAnds,iVar10);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    uVar16 = (uint)*(undefined8 *)pGVar12;
    if (((int)uVar16 < 0) || (uVar16 = uVar16 & 0x1fffffff, uVar16 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x301,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    uVar16 = pGVar12[-(ulong)uVar16].Value;
    if (uVar16 == 0xffffffff) {
      __assert_fail("~Gia_ObjFanin0(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x302,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    uVar17 = pGVar12[-(ulong)((uint)((ulong)*(undefined8 *)pGVar12 >> 0x20) & 0x1fffffff)].Value;
    if (uVar17 == 0xffffffff) {
      __assert_fail("~Gia_ObjFanin1(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x303,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    pwVar2 = p->vCutsI1->pArray;
    pwVar3 = p->vCutsI2->pArray;
    pwVar4 = p->vCutsN1->pArray;
    pwVar5 = p->vCutsN2->pArray;
    iVar6 = Vec_IntEntry(p->vCutsStart,uVar16);
    iVar7 = Vec_IntEntry(p->vCutsStart,uVar17);
    iVar8 = Vec_IntEntry(p->vCutsNum,uVar16);
    iVar9 = Vec_IntEntry(p->vCutsNum,uVar17);
    if (uVar22 == 0x80) {
      __assert_fail("Obj >= 0 && Obj < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x2ab,"void Sbl_ManComputeCutsOne(Sbl_Man_t *, int, int, int)");
    }
    p->vTempI1->nSize = 0;
    p->vTempI2->nSize = 0;
    p->vTempN1->nSize = 0;
    p->vTempN2->nSize = 0;
    for (lVar20 = (long)iVar6; lVar26 = (long)iVar7, lVar20 < iVar8 + iVar6; lVar20 = lVar20 + 1) {
      for (; lVar26 < iVar9 + iVar7; lVar26 = lVar26 + 1) {
        if (6 < p->LutSize) {
          __assert_fail("LutSize <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                        ,0x274,"int Sbl_CutIsFeasible(word, word, word, word, int)");
        }
        Entry = pwVar2[lVar26] | pwVar2[lVar20];
        Entry_01 = pwVar3[lVar26] | pwVar3[lVar20];
        Entry_00 = pwVar4[lVar26] | pwVar4[lVar20];
        Entry_02 = pwVar5[lVar26] | pwVar5[lVar20];
        uVar27 = Entry - 1 & Entry;
        uVar18 = Entry_01 - 1 & Entry_01;
        uVar30 = Entry_00 - 1 & Entry_00;
        uVar36 = uVar27 - 1 & uVar27;
        uVar23 = Entry_02 - 1 & Entry_02;
        uVar28 = uVar18 - 1 & uVar18;
        uVar34 = uVar30 - 1 & uVar30;
        uVar21 = uVar36 - 1 & uVar36;
        uVar39 = uVar23 - 1 & uVar23;
        uVar37 = uVar28 - 1 & uVar28;
        uVar24 = uVar34 - 1 & uVar34;
        uVar33 = uVar39 - 1 & uVar39;
        uVar19 = uVar21 - 1 & uVar21;
        uVar29 = uVar37 - 1 & uVar37;
        uVar32 = uVar24 - 1 & uVar24;
        uVar35 = uVar33 - 1 & uVar33;
        uVar16 = (uint)(uVar35 != 0) + (uint)(uVar32 != 0) +
                 (uint)(uVar29 != 0) +
                 (uint)(uVar34 != 0) +
                 (uint)(uVar21 != 0) +
                 (uint)(uVar30 != 0) +
                 (uint)(uVar36 != 0) +
                 (uint)(Entry_01 != 0) + (uint)(Entry != 0) + (uint)(uVar27 != 0) +
                 (uint)(Entry_00 != 0) + (uint)(uVar18 != 0) + (uint)(Entry_02 != 0) +
                 (uint)(uVar28 != 0) + (uint)(uVar23 != 0) + (uint)(uVar37 != 0) +
                 (uint)(uVar19 != 0) + (uint)(uVar39 != 0) + (uint)(uVar24 != 0) +
                 (uint)(uVar33 != 0);
        if (p->LutSize < 5) {
          if (uVar16 < 5) {
LAB_00621f8b:
            pVVar31 = p->vTempI1;
            p_00 = p->vTempN1;
            uVar16 = pVVar31->nSize;
            if (uVar16 != p_00->nSize) {
              __assert_fail("vCutsI1->nSize == vCutsN1->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x282,
                            "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                           );
            }
            p_01 = p->vTempI2;
            p_02 = p->vTempN2;
            if (p_01->nSize != p_02->nSize) {
              __assert_fail("vCutsI2->nSize == vCutsN2->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x283,
                            "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                           );
            }
            uVar18 = 0;
            if (0 < (int)uVar16) {
              uVar18 = (ulong)uVar16;
            }
            for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
              if (((((pVVar31->pArray[uVar19] & ~Entry) == 0) &&
                   ((p_01->pArray[uVar19] & ~Entry_01) == 0)) &&
                  ((p_00->pArray[uVar19] & ~Entry_00) == 0)) &&
                 ((p_02->pArray[uVar19] & ~Entry_02) == 0)) goto LAB_0062213e;
            }
            nSizeNew = 0;
            for (lVar38 = 0; lVar38 < (int)uVar16; lVar38 = lVar38 + 1) {
              if ((((Entry & ~pVVar31->pArray[lVar38]) != 0) ||
                  ((Entry_01 & ~p_01->pArray[lVar38]) != 0)) ||
                 (((Entry_00 & ~p_00->pArray[lVar38]) != 0 ||
                  ((Entry_02 & ~p_02->pArray[lVar38]) != 0)))) {
                Vec_WrdWriteEntry(pVVar31,nSizeNew,pVVar31->pArray[lVar38]);
                Vec_WrdWriteEntry(p_01,nSizeNew,p_01->pArray[lVar38]);
                Vec_WrdWriteEntry(p_00,nSizeNew,p_00->pArray[lVar38]);
                Vec_WrdWriteEntry(p_02,nSizeNew,p_02->pArray[lVar38]);
                nSizeNew = nSizeNew + 1;
                uVar16 = pVVar31->nSize;
              }
            }
            Vec_WrdShrink(pVVar31,nSizeNew);
            Vec_WrdShrink(p_01,nSizeNew);
            Vec_WrdShrink(p_00,nSizeNew);
            Vec_WrdShrink(p_02,nSizeNew);
            Vec_WrdPush(pVVar31,Entry);
            Vec_WrdPush(p_01,Entry_01);
            Vec_WrdPush(p_00,Entry_00);
            Vec_WrdPush(p_02,Entry_02);
          }
        }
        else {
          uVar19 = uVar19 - 1 & uVar19;
          uVar29 = uVar29 - 1 & uVar29;
          uVar32 = uVar32 - 1 & uVar32;
          uVar35 = uVar35 - 1 & uVar35;
          if ((((((((((uint)((uVar19 & uVar19 - 1) != 0) - (uint)(uVar19 == 0)) -
                    (uint)(uVar29 == 0)) - (uint)((uVar29 - 1 & uVar29) == 0)) - (uint)(uVar32 == 0)
                  ) - (uint)((uVar32 - 1 & uVar32) == 0)) - (uint)(uVar35 == 0)) + 7) -
              (uint)((uVar35 - 1 & uVar35) == 0)) + uVar16 < 7) goto LAB_00621f8b;
        }
LAB_0062213e:
      }
    }
    Vec_IntPush(p->vCutsStart,p->vCutsI1->nSize);
    Vec_IntPush(p->vCutsNum,p->vTempI1->nSize + 1);
    Vec_WrdAppend(p->vCutsI1,p->vTempI1);
    Vec_WrdAppend(p->vCutsI2,p->vTempI2);
    Vec_WrdAppend(p->vCutsN1,p->vTempN1);
    Vec_WrdAppend(p->vCutsN2,p->vTempN2);
    Vec_WrdPush(p->vCutsI1,0);
    Vec_WrdPush(p->vCutsI2,0);
    if (uVar22 < 0x40) {
      Vec_WrdPush(p->vCutsN1,1L << ((byte)uVar22 & 0x3f));
      pVVar31 = p->vCutsN2;
      wVar25 = 0;
    }
    else {
      Vec_WrdPush(p->vCutsN1,0);
      pVVar31 = p->vCutsN2;
      wVar25 = 1L << ((byte)uVar22 & 0x3f);
    }
    Vec_WrdPush(pVVar31,wVar25);
    for (iVar6 = 0; iVar6 <= p->vTempI1->nSize; iVar6 = iVar6 + 1) {
      Vec_IntPush(p->vCutsObj,iVar10);
    }
    pGVar12->Value = p->vLeaves->nSize + iVar10;
  }
  if (p->vCutsStart->nSize != iVar15) {
    __assert_fail("Vec_IntSize(p->vCutsStart) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x307,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (p->vCutsNum->nSize != iVar15) {
    __assert_fail("Vec_IntSize(p->vCutsNum) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x308,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar15 = p->vCutsI1->nSize;
  if (iVar15 != p->vCutsN1->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_WrdSize(p->vCutsN1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x309,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (p->vCutsI2->nSize != p->vCutsN2->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI2) == Vec_WrdSize(p->vCutsN2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (iVar15 != p->vCutsObj->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_IntSize(p->vCutsObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30b,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  p->vRootVars->nSize = 0;
  for (iVar15 = 0; iVar15 < p->vRoots->nSize; iVar15 = iVar15 + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(p->vRoots,iVar15);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjId(p->pGia,pGVar12);
    if ((~*(uint *)pGVar12 & 0x9fffffff) != 0) {
      iVar6 = Gia_ObjIsLut2(p->pGia,iVar6);
      if (iVar6 == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x313,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if (pGVar12->Value == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x314,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      Vec_IntPush(p->vRootVars,pGVar12->Value - p->vLeaves->nSize);
    }
  }
  p->vPolar->nSize = 0;
  p->vSolInit->nSize = 0;
  for (iVar15 = 0; iVar15 < p->vAnds->nSize; iVar15 = iVar15 + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(p->vAnds,iVar15);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjId(p->pGia,pGVar12);
    iVar10 = Gia_ObjIsLut2(p->pGia,iVar6);
    if (iVar10 != 0) {
      if (pGVar12->Value != p->vLeaves->nSize + iVar15) {
        __assert_fail("(int)pObj->Value == Vec_IntSize(p->vLeaves) + i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,800,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      Vec_IntPush(p->vPolar,iVar15);
      Vec_IntPush(p->vSolInit,iVar15);
      pVVar13 = Gia_ObjLutFanins2(p->pGia,iVar6);
      uVar22 = 0;
      local_a0 = 0;
      local_a8 = 0;
      local_b0 = 0;
      for (iVar6 = 0; iVar6 < pVVar13->nSize; iVar6 = iVar6 + 1) {
        iVar10 = Vec_IntEntry(pVVar13,iVar6);
        pGVar12 = Gia_ManObj(p->pGia,iVar10);
        uVar16 = pGVar12->Value;
        if (p->vLeaves->nSize <= (int)uVar16) {
          iVar10 = Gia_ObjIsLut2(p->pGia,iVar10);
          if (iVar10 == 0) {
            __assert_fail("(int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x32a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
          }
          uVar16 = pGVar12->Value;
        }
        if (uVar16 != 0xffffffff) {
          iVar10 = p->vLeaves->nSize;
          uVar17 = uVar16 - iVar10;
          if ((int)uVar16 < iVar10) {
            if ((int)uVar16 < 0x40) {
              uVar22 = uVar22 | 1L << ((ulong)uVar16 & 0x3f);
            }
            else {
              local_a0 = local_a0 | 1L << ((ulong)(byte)((char)uVar16 - 0x40) & 0x3f);
            }
          }
          else if (uVar17 < 0x40) {
            local_a8 = local_a8 | 1L << ((ulong)uVar17 & 0x3f);
          }
          else {
            local_b0 = local_b0 | 1L << ((ulong)(byte)((char)uVar17 - 0x40) & 0x3f);
          }
        }
      }
      iVar10 = p->vLeaves->nSize + iVar15;
      pwVar2 = p->vCutsI1->pArray;
      pwVar3 = p->vCutsI2->pArray;
      pwVar4 = p->vCutsN1->pArray;
      pwVar5 = p->vCutsN2->pArray;
      iVar6 = Vec_IntEntry(p->vCutsStart,iVar10);
      iVar10 = Vec_IntEntry(p->vCutsNum,iVar10);
      for (lVar20 = (long)iVar6; lVar20 < iVar10 + iVar6; lVar20 = lVar20 + 1) {
        if (((pwVar2[lVar20] == uVar22) && (pwVar3[lVar20] == local_a0)) &&
           ((pwVar4[lVar20] == local_a8 && (pwVar5[lVar20] == local_b0)))) {
          if (-1 < lVar20) {
            Vec_IntPush(p->vPolar,(int)lVar20 + p->FirstVar);
          }
          break;
        }
      }
    }
  }
  for (iVar15 = 0; iVar15 < p->vLeaves->nSize; iVar15 = iVar15 + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(p->vLeaves,iVar15);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    pGVar12->Value = 0xffffffff;
  }
  for (iVar15 = 0; iVar15 < p->vAnds->nSize; iVar15 = iVar15 + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(p->vAnds,iVar15);
    pGVar12 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    pGVar12->Value = 0xffffffff;
  }
  aVar14 = Abc_Clock();
  p->timeCut = p->timeCut + (aVar14 - aVar11);
  return p->vCutsI1->nSize;
}

Assistant:

int Sbl_ManComputeCuts( Sbl_Man_t * p )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; Vec_Int_t * vFanins;
    int i, k, Index, Fanin, nObjs = Vec_IntSize(p->vLeaves) + Vec_IntSize(p->vAnds);
    assert( Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars );
    // assign leaf cuts
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vCutsNum );
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
    {
        Vec_IntPush( p->vCutsStart, Vec_WrdSize(p->vCutsI1) );
        Vec_IntPush( p->vCutsObj, -1 );
        Vec_IntPush( p->vCutsNum, 1 );
        if ( i < 64 )
        {
            Vec_WrdPush( p->vCutsI1, (((word)1) << i) );
            Vec_WrdPush( p->vCutsI2, 0 );
        }
        else
        {
            Vec_WrdPush( p->vCutsI1, 0 );
            Vec_WrdPush( p->vCutsI2, (((word)1) << (i-64)) );
        }
        Vec_WrdPush( p->vCutsN1, 0 );
        Vec_WrdPush( p->vCutsN2, 0 );
        pObj->Value = i;
    }
    // assign internal cuts
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        assert( ~Gia_ObjFanin0(pObj)->Value );
        assert( ~Gia_ObjFanin1(pObj)->Value );
        Sbl_ManComputeCutsOne( p, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, i );
        pObj->Value = Vec_IntSize(p->vLeaves) + i;
    }
    assert( Vec_IntSize(p->vCutsStart) == nObjs );
    assert( Vec_IntSize(p->vCutsNum)   == nObjs );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_WrdSize(p->vCutsN1) );
    assert( Vec_WrdSize(p->vCutsI2)    == Vec_WrdSize(p->vCutsN2) );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_IntSize(p->vCutsObj) );
    // check that roots are mapped nodes
    Vec_IntClear( p->vRootVars );
    Gia_ManForEachObjVec( p->vRoots, p->pGia, pObj, i )
    {
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsLut2(p->pGia, Obj) );
        assert( ~pObj->Value );
        Vec_IntPush( p->vRootVars, pObj->Value - Vec_IntSize(p->vLeaves) );
    }
    // create current solution
    Vec_IntClear( p->vPolar );
    Vec_IntClear( p->vSolInit );
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        word CutI1 = 0, CutI2 = 0, CutN1 = 0, CutN2 = 0;
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( !Gia_ObjIsLut2(p->pGia, Obj) )
            continue;
        assert( (int)pObj->Value == Vec_IntSize(p->vLeaves) + i );
        // add node
        Vec_IntPush( p->vPolar, i );
        Vec_IntPush( p->vSolInit, i );
        // add its cut
        //Gia_LutForEachFaninObj( p->pGia, Obj, pFanin, k )
        vFanins = Gia_ObjLutFanins2( p->pGia, Obj );
        Vec_IntForEachEntry( vFanins, Fanin, k )
        {
            Gia_Obj_t * pFanin = Gia_ManObj( p->pGia, Fanin );
            assert( (int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin) );
//            if ( ~pFanin->Value == 0 )
//                Gia_ManPrintConeMulti( p->pGia, p->vAnds, p->vLeaves, p->vPath );
            if ( ~pFanin->Value == 0 ) 
                continue;
            assert( ~pFanin->Value );
            if ( (int)pFanin->Value < Vec_IntSize(p->vLeaves) )
            {
                if ( (int)pFanin->Value < 64 )
                    CutI1 |= ((word)1 << pFanin->Value);
                else
                    CutI2 |= ((word)1 << (pFanin->Value - 64));
            }
            else
            {
                if ( pFanin->Value - Vec_IntSize(p->vLeaves) < 64 )
                    CutN1 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves)));
                else
                    CutN2 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves) - 64));
            }
        }
        // find the new cut
        Index = Sbl_ManFindCut( p, Vec_IntSize(p->vLeaves) + i, CutI1, CutI2, CutN1, CutN2 );
        if ( Index < 0 )
        {
            //printf( "Cannot find the available cut.\n" );
            continue;
        }
        assert( Index >= 0 );
        Vec_IntPush( p->vPolar, p->FirstVar+Index );
    }
    // clean value
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
        pObj->Value = ~0;
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
        pObj->Value = ~0;
    p->timeCut += Abc_Clock() - clk;
    return Vec_WrdSize(p->vCutsI1);
}